

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

void __thiscall
wasm::OrderedFixedStorage<unsigned_int,_3UL>::erase
          (OrderedFixedStorage<unsigned_int,_3UL> *this,uint *x)

{
  value_type_conflict2 vVar1;
  reference pvVar2;
  ulong local_28;
  size_t j;
  size_t i;
  uint *x_local;
  OrderedFixedStorage<unsigned_int,_3UL> *this_local;
  
  j = 0;
  while( true ) {
    if ((this->super_FixedStorageBase<unsigned_int,_3UL>).used <= j) {
      return;
    }
    pvVar2 = std::array<unsigned_int,_3UL>::operator[]
                       (&(this->super_FixedStorageBase<unsigned_int,_3UL>).storage,j);
    if (*pvVar2 == *x) break;
    j = j + 1;
  }
  while (local_28 = j + 1, local_28 < (this->super_FixedStorageBase<unsigned_int,_3UL>).used) {
    pvVar2 = std::array<unsigned_int,_3UL>::operator[]
                       (&(this->super_FixedStorageBase<unsigned_int,_3UL>).storage,local_28);
    vVar1 = *pvVar2;
    pvVar2 = std::array<unsigned_int,_3UL>::operator[]
                       (&(this->super_FixedStorageBase<unsigned_int,_3UL>).storage,j);
    *pvVar2 = vVar1;
    j = local_28;
  }
  (this->super_FixedStorageBase<unsigned_int,_3UL>).used =
       (this->super_FixedStorageBase<unsigned_int,_3UL>).used - 1;
  return;
}

Assistant:

void erase(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        // We found the item; move things backwards and shrink.
        for (size_t j = i + 1; j < this->used; j++) {
          this->storage[j - 1] = this->storage[j];
        }
        this->used--;
        return;
      }
    }
  }